

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O0

mbedtls_ct_condition_t mbedtls_mpi_core_lt_ct(mbedtls_mpi_uint *A,mbedtls_mpi_uint *B,size_t limbs)

{
  mbedtls_ct_condition_t mVar1;
  mbedtls_ct_condition_t x;
  mbedtls_ct_condition_t mVar2;
  size_t local_40;
  size_t i;
  mbedtls_ct_condition_t done;
  mbedtls_ct_condition_t cond;
  mbedtls_ct_condition_t ret;
  size_t limbs_local;
  mbedtls_mpi_uint *B_local;
  mbedtls_mpi_uint *A_local;
  
  cond = mbedtls_ct_compiler_opaque(0);
  mbedtls_ct_compiler_opaque(0);
  i = mbedtls_ct_compiler_opaque(0);
  for (local_40 = limbs; local_40 != 0; local_40 = local_40 - 1) {
    mVar1 = mbedtls_ct_uint_lt(B[local_40 - 1],A[local_40 - 1]);
    mVar1 = mbedtls_ct_bool_or(i,mVar1);
    x = mbedtls_ct_uint_lt(A[local_40 - 1],B[local_40 - 1]);
    mVar2 = mbedtls_ct_bool_not(mVar1);
    mVar2 = mbedtls_ct_bool_and(x,mVar2);
    cond = mbedtls_ct_bool_or(cond,mVar2);
    i = mbedtls_ct_bool_or(mVar1,x);
  }
  return cond;
}

Assistant:

mbedtls_ct_condition_t mbedtls_mpi_core_lt_ct(const mbedtls_mpi_uint *A,
                                              const mbedtls_mpi_uint *B,
                                              size_t limbs)
{
    mbedtls_ct_condition_t ret = MBEDTLS_CT_FALSE, cond = MBEDTLS_CT_FALSE, done = MBEDTLS_CT_FALSE;

    for (size_t i = limbs; i > 0; i--) {
        /*
         * If B[i - 1] < A[i - 1] then A < B is false and the result must
         * remain 0.
         *
         * Again even if we can make a decision, we just mark the result and
         * the fact that we are done and continue looping.
         */
        cond = mbedtls_ct_uint_lt(B[i - 1], A[i - 1]);
        done = mbedtls_ct_bool_or(done, cond);

        /*
         * If A[i - 1] < B[i - 1] then A < B is true.
         *
         * Again even if we can make a decision, we just mark the result and
         * the fact that we are done and continue looping.
         */
        cond = mbedtls_ct_uint_lt(A[i - 1], B[i - 1]);
        ret  = mbedtls_ct_bool_or(ret, mbedtls_ct_bool_and(cond, mbedtls_ct_bool_not(done)));
        done = mbedtls_ct_bool_or(done, cond);
    }

    /*
     * If all the limbs were equal, then the numbers are equal, A < B is false
     * and leaving the result 0 is correct.
     */

    return ret;
}